

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

Result __thiscall
testing::internal::FunctionMockerBase<void_()>::PerformDefaultAction
          (FunctionMockerBase<void_()> *this,ArgumentTuple *args,string *call_description)

{
  OnCallSpec<void_()> *this_00;
  pointer pcVar1;
  char cVar2;
  Action<void_()> *this_01;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar3;
  string message;
  undefined **local_50;
  undefined8 local_48;
  undefined *local_40 [2];
  
  ppvVar3 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar3 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_001248ac;
    this_00 = (OnCallSpec<void_()> *)ppvVar3[-1];
    ppvVar3 = ppvVar3 + -1;
    local_48 = 0;
    local_50 = &PTR__MatchResultListener_001d3ba0;
    cVar2 = (**(code **)(**(long **)(this_00 + 0x20) + 0x20))
                      (*(long **)(this_00 + 0x20),args,&local_50);
  } while (cVar2 == '\0');
  if (this_00 == (OnCallSpec<void_()> *)0x0) {
LAB_001248ac:
    pcVar1 = (call_description->_M_dataplus)._M_p;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + call_description->_M_string_length);
    std::__cxx11::string::append((char *)&local_50);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  else {
    this_01 = OnCallSpec<void_()>::GetAction(this_00);
    Action<void_()>::Perform(this_01,args);
  }
  return;
}

Assistant:

Result PerformDefaultAction(const ArgumentTuple& args,
                              const string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(args);
    }
    const string message = call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }